

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

string * __thiscall
chibi::base64_encode_abi_cxx11_
          (string *__return_storage_ptr__,chibi *this,void *in_bytes,size_t numBytes)

{
  uint uVar1;
  int i;
  long lVar2;
  chibi cVar3;
  void *pvVar4;
  int i_1;
  int iVar5;
  ulong uVar6;
  uchar inbuf [3];
  uchar outbuf [4];
  chibi local_4f;
  byte local_4e;
  byte local_4d;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ulong local_40;
  long local_38;
  
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (in_bytes != (void *)0x0) {
    local_40 = ((long)in_bytes * 8 + 4U) / 6 + 3 & 0xfffffffffffffffc;
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pvVar4 = (void *)0x0;
    do {
      lVar2 = 0;
      do {
        if ((void *)(lVar2 + (long)pvVar4) < in_bytes) {
          cVar3 = this[lVar2];
        }
        else {
          cVar3 = (chibi)0x0;
        }
        (&local_4f)[lVar2] = cVar3;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      local_38 = (long)in_bytes - (long)pvVar4;
      local_4c = (byte)local_4f >> 2;
      local_4b = ((byte)local_4f & 3) << 4 | local_4e >> 4;
      local_4a = (local_4e & 0xf) << 2 | local_4d >> 6;
      local_49 = local_4d & 0x3f;
      uVar1 = (local_38 != 2) + 3;
      if (local_38 == 1) {
        uVar1 = 2;
      }
      uVar6 = 0;
      do {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      if (local_38 - 1U < 2) {
        iVar5 = 3 - uVar1;
        if (3 < uVar1) {
          iVar5 = 0;
        }
        iVar5 = iVar5 + 1;
        do {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      pvVar4 = (void *)((long)pvVar4 + 3);
      this = this + 3;
    } while (pvVar4 < in_bytes);
    if (__return_storage_ptr__->_M_string_length != local_40) {
      __assert_fail("result.size() == expectedResultSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marcel303[P]chibi/base64.cpp"
                    ,0x4d,"std::string chibi::base64_encode(const void *, const size_t)");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(const void * in_bytes, const size_t numBytes)
	{
		std::string result;
		
		if (numBytes == 0)
			return result;

		const uint8_t * bytes = (const uint8_t*)in_bytes;
		const size_t byteCount = numBytes;
		
		const size_t expectedCharacterCount = (byteCount * 8 + 5) / 6;
		const size_t expectedResultSize = (expectedCharacterCount + 3) / 4 * 4;
		result.reserve(expectedResultSize);
		
		size_t baseIndex = 0;
		
		unsigned char inbuf[3];
		unsigned char outbuf[4];
		
		for (;;)
		{
			if (baseIndex >= byteCount)
				break;

			const size_t todo = byteCount - baseIndex;
			
			for (int i = 0; i < 3; i++)
			{
				const size_t index = baseIndex + i;
				
				if (index < byteCount)
					inbuf[i] = bytes[index];
				else
					inbuf[i] = 0;
			}
			
			outbuf[0] = (inbuf [0] & 0xFC) >> 2;
			outbuf[1] = ((inbuf [0] & 0x03) << 4) | ((inbuf [1] & 0xF0) >> 4);
			outbuf[2] = ((inbuf [1] & 0x0F) << 2) | ((inbuf [2] & 0xC0) >> 6);
			outbuf[3] = inbuf [2] & 0x3F;
			
			int copyCount = 4;
			
			switch (todo)
			{
				case 1: 
					copyCount = 2; 
					break;
				case 2: 
					copyCount = 3; 
					break;
			}
			
			for (int i = 0; i < copyCount; i++)
				result.push_back(encodingTable[outbuf[i]]);
			
			for (int i = copyCount; i < 4; i++)
				result.push_back('=');
			
			baseIndex += 3;
		}
		
		assert(result.size() == expectedResultSize); // if unequal, we either reserved too much memory, or had to grow/realloc the resulting array
		
		return result;
	}